

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_u16le(CBS *cbs,uint16_t *out)

{
  ulong uVar1;
  uint16_t *puVar2;
  
  uVar1 = cbs->len;
  if (1 < uVar1) {
    puVar2 = (uint16_t *)cbs->data;
    cbs->data = (uint8_t *)(puVar2 + 1);
    cbs->len = uVar1 - 2;
    *out = *puVar2;
  }
  return (uint)(1 < uVar1);
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}